

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

void poll_cb(uv_fs_t *req)

{
  int iVar1;
  long *plVar2;
  uv_stat_t *b;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t interval;
  poll_ctx *ctx;
  uv_stat_t *statbuf;
  uv_fs_t *req_local;
  
  plVar2 = &req[-1].statbuf.st_ctim.tv_nsec;
  if (*plVar2 == 0) {
    uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
    uv_fs_req_cleanup(req);
  }
  else {
    if (req->result == 0) {
      b = &req->statbuf;
      if (((int)req[-1].statbuf.st_birthtim.tv_sec != 0) &&
         (((int)req[-1].statbuf.st_birthtim.tv_sec < 0 ||
          (iVar1 = statbuf_eq((uv_stat_t *)(req + 1),b), iVar1 == 0)))) {
        (**(code **)&req[-1].file)(*plVar2,0,req + 1,b);
      }
      memcpy(req + 1,b,0xa0);
      *(undefined4 *)&req[-1].statbuf.st_birthtim.tv_sec = 1;
    }
    else if ((long)(int)req[-1].statbuf.st_birthtim.tv_sec != req->result) {
      (**(code **)&req[-1].file)(*plVar2,req->result & 0xffffffff,req + 1,&zero_statbuf);
      *(int *)&req[-1].statbuf.st_birthtim.tv_sec = (int)req->result;
    }
    uv_fs_req_cleanup(req);
    if (*plVar2 == 0) {
      uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
    }
    else {
      uVar3 = (ulong)*(uint *)((long)&req[-1].statbuf.st_birthtim.tv_sec + 4);
      uVar4 = uv_now((uv_loop_t *)req[-1].new_path);
      iVar1 = uv_timer_start((uv_timer_t *)&req[-1].mode,timer_cb,
                             uVar3 - (uVar4 - req[-1].statbuf.st_birthtim.tv_nsec) % uVar3,0);
      if (iVar1 != 0) {
        abort();
      }
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_t* req) {
  uv_stat_t* statbuf;
  struct poll_ctx* ctx;
  uint64_t interval;

  ctx = container_of(req, struct poll_ctx, fs_req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped or closed */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    uv_fs_req_cleanup(req);
    return;
  }

  if (req->result != 0) {
    if (ctx->busy_polling != req->result) {
      ctx->poll_cb(ctx->parent_handle,
                   req->result,
                   &ctx->statbuf,
                   &zero_statbuf);
      ctx->busy_polling = req->result;
    }
    goto out;
  }

  statbuf = &req->statbuf;

  if (ctx->busy_polling != 0)
    if (ctx->busy_polling < 0 || !statbuf_eq(&ctx->statbuf, statbuf))
      ctx->poll_cb(ctx->parent_handle, 0, &ctx->statbuf, statbuf);

  ctx->statbuf = *statbuf;
  ctx->busy_polling = 1;

out:
  uv_fs_req_cleanup(req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped by callback */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    return;
  }

  /* Reschedule timer, subtract the delay from doing the stat(). */
  interval = ctx->interval;
  interval -= (uv_now(ctx->loop) - ctx->start_time) % interval;

  if (uv_timer_start(&ctx->timer_handle, timer_cb, interval, 0))
    abort();
}